

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial.h
# Opt level: O2

void __thiscall
embree::avx::SpatialBinInfo<16UL,_embree::PrimRef>::SpatialBinInfo
          (SpatialBinInfo<16UL,_embree::PrimRef> *this,
          SpatialBinInfo<16UL,_embree::PrimRef> *param_2)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  Vec3fa *pVVar4;
  Vec3fa *pVVar5;
  long lVar6;
  long lVar7;
  
  pVVar4 = &param_2->bounds[0][0].upper;
  pVVar5 = &this->bounds[0][0].upper;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(((BBox3fa *)(pVVar4 + -1))->lower).field_0 + lVar7);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(((BBox3fa *)(pVVar5 + -1))->lower).field_0 + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      puVar1 = (undefined8 *)((long)&pVVar4->field_0 + lVar7);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pVVar5->field_0 + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x60);
    lVar6 = lVar6 + 1;
    pVVar4 = pVVar4 + 6;
    pVVar5 = pVVar5 + 6;
  } while (lVar6 != 0x10);
  lVar6 = 0;
  do {
    puVar1 = (undefined8 *)((long)&param_2->numBegin[0].field_0 + lVar6);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&this->numBegin[0].field_0 + lVar6);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x100);
  lVar6 = 0;
  do {
    puVar1 = (undefined8 *)((long)&param_2->numEnd[0].field_0 + lVar6);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&this->numEnd[0].field_0 + lVar6);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x100);
  return;
}

Assistant:

struct __aligned(64) SpatialBinInfo
    {
      SpatialBinInfo() {
      }